

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacAlgorithm.cpp
# Opt level: O0

bool __thiscall MacAlgorithm::signInit(MacAlgorithm *this,SymmetricKey *key)

{
  SymmetricKey *key_local;
  MacAlgorithm *this_local;
  bool local_1;
  
  if ((key == (SymmetricKey *)0x0) || (this->currentOperation != NONE)) {
    local_1 = false;
  }
  else {
    this->currentKey = key;
    this->currentOperation = SIGN;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MacAlgorithm::signInit(const SymmetricKey* key)
{
	if ((key == NULL) || (currentOperation != NONE))
	{
		return false;
	}

	currentKey = key;
	currentOperation = SIGN;

	return true;
}